

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileSort.cpp
# Opt level: O0

int main(void)

{
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [36];
  undefined4 local_c;
  
  local_c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"file1.txt",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"file2.txt",&local_69);
  sortTwoFiles((string *)local_30,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return 0;
}

Assistant:

int main()
{
    sortTwoFiles("file1.txt", "file2.txt");
    return 0;
}